

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

int Abc_NtkDsdLocal(Abc_Ntk_t *pNtk,int fVerbose,int fRecursive)

{
  DdManager *dd_00;
  int iVar1;
  Dsd_Manager_t *dMan;
  uint local_68 [2];
  int pCounters [11];
  int i;
  Vec_Ptr_t *vNodes;
  DdManager *dd;
  Dsd_Manager_t *pManDsd;
  int fRecursive_local;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  dd_00 = (DdManager *)pNtk->pManFunc;
  memset(local_68,0,0x2c);
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0x149,"int Abc_NtkDsdLocal(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkMinimumBase(pNtk);
  dMan = Dsd_ManagerStart(dd_00,dd_00->size,0);
  register0x00000000 = Abc_NtkCollectNodesForDsd(pNtk);
  for (pCounters[9] = 0; pCounters[9] < stack0xffffffffffffffc8->nSize;
      pCounters[9] = pCounters[9] + 1) {
    Abc_NodeDecompDsdAndMux
              ((Abc_Obj_t *)stack0xffffffffffffffc8->pArray[pCounters[9]],stack0xffffffffffffffc8,
               dMan,fRecursive,(int *)local_68);
  }
  Vec_PtrFree(stack0xffffffffffffffc8);
  if (fVerbose != 0) {
    printf("Number of non-decomposable functions:\n");
    for (pCounters[9] = 3; pCounters[9] < 10; pCounters[9] = pCounters[9] + 1) {
      printf("Inputs = %d.  Functions = %6d.\n",(ulong)(uint)pCounters[9],
             (ulong)(uint)pCounters[(long)pCounters[9] + -2]);
    }
    printf("Inputs > %d.  Functions = %6d.\n",9,(ulong)(uint)pCounters[8]);
  }
  Dsd_ManagerStop(dMan);
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    printf("Abc_NtkDsdRecursive: The network check has failed.\n");
  }
  pNtk_local._4_4_ = (uint)(iVar1 != 0);
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive )
{
    Dsd_Manager_t * pManDsd;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    Vec_Ptr_t * vNodes;
    int i;
    int pCounters[11] = {0};

    assert( Abc_NtkIsBddLogic(pNtk) );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );

    // start the DSD manager
    pManDsd = Dsd_ManagerStart( dd, dd->size, 0 );

    // collect nodes for decomposition
    vNodes = Abc_NtkCollectNodesForDsd( pNtk );
    for ( i = 0; i < vNodes->nSize; i++ )
        Abc_NodeDecompDsdAndMux( (Abc_Obj_t *)vNodes->pArray[i], vNodes, pManDsd, fRecursive, pCounters );
    Vec_PtrFree( vNodes );

    if ( fVerbose )
    {
        printf( "Number of non-decomposable functions:\n" );
        for ( i = 3; i < 10; i++ )
            printf( "Inputs = %d.  Functions = %6d.\n", i, pCounters[i] );
        printf( "Inputs > %d.  Functions = %6d.\n", 9, pCounters[10] );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );

    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkDsdRecursive: The network check has failed.\n" );
        return 0;
    }
    return 1;
}